

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O1

void pdf_array_delete(hd_context *ctx,pdf_obj *obj,int i)

{
  pdf_obj pVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    obj = pdf_resolve_indirect_chain(ctx,obj);
  }
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'a')) {
    if ((-1 < i) && (i < (int)obj[5])) {
      uVar3 = (ulong)(uint)i;
      pdf_drop_obj(ctx,*(pdf_obj **)(*(long *)(obj + 8) + uVar3 * 8));
      *(undefined8 *)(*(long *)(obj + 8) + uVar3 * 8) = 0;
      pVar1 = obj[5];
      obj[5] = (pdf_obj)((int)pVar1 + -1);
      memmove((void *)(*(long *)(obj + 8) + uVar3 * 8),(void *)(*(long *)(obj + 8) + uVar3 * 8 + 8),
              (((long)(int)pVar1 - (long)i) + -1) * 8);
      return;
    }
    hd_throw(ctx,2,"index out of bounds");
  }
  pcVar2 = pdf_objkindstr(obj);
  hd_throw(ctx,2,"not an array (%s)",pcVar2);
}

Assistant:

void
pdf_array_delete(hd_context *ctx, pdf_obj *obj, int i)
{
    RESOLVE(obj);
    if (!OBJ_IS_ARRAY(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not an array (%s)", pdf_objkindstr(obj));
    if (i < 0 || i >= ARRAY(obj)->len)
        hd_throw(ctx, HD_ERROR_GENERIC, "index out of bounds");

    prepare_object_for_alteration(ctx, obj, NULL);
    pdf_drop_obj(ctx, ARRAY(obj)->items[i]);
    ARRAY(obj)->items[i] = 0;
    ARRAY(obj)->len--;
    memmove(ARRAY(obj)->items + i, ARRAY(obj)->items + i + 1, (ARRAY(obj)->len - i) * sizeof(pdf_obj*));
}